

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_validate_chunk_table(exr_context_t ctxt,int part_index)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int in_ESI;
  char *in_RDI;
  uint64_t cchunk;
  int ci;
  exr_const_priv_part_t part;
  uint64_t *in_stack_00000020;
  int complete;
  uint64_t *ctable;
  uint64_t maxoff;
  uint64_t chunkmin;
  exr_result_t rv;
  exr_const_context_t in_stack_ffffffffffffffb0;
  int local_44;
  long local_30;
  ulong local_28;
  ulong local_20;
  exr_result_t local_4;
  
  local_28 = 0xffffffffffffffff;
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffb0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffb0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      local_4 = extract_chunk_table((exr_const_context_t)chunkmin,(exr_const_priv_part_t)maxoff,
                                    (uint64_t **)ctable,in_stack_00000020);
      if (local_4 == 0) {
        if (0 < *(long *)(in_RDI + 0x98)) {
          local_28 = *(ulong *)(in_RDI + 0x98);
        }
        bVar3 = true;
        for (local_44 = 0; local_44 < *(int *)(lVar1 + 0xf4); local_44 = local_44 + 1) {
          uVar2 = *(ulong *)(local_30 + (long)local_44 * 8);
          if ((uVar2 < local_20) || (local_28 <= uVar2)) {
            bVar3 = false;
            break;
          }
        }
        if (bVar3) {
          local_4 = 0;
        }
        else {
          local_4 = 0x18;
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_validate_chunk_table (exr_context_t ctxt, int part_index)
{
    exr_result_t rv;
    uint64_t     chunkmin, maxoff = ((uint64_t) -1);
    uint64_t*    ctable;
    int          complete;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    /* need to read from the file to get the packed chunk size */
    rv = extract_chunk_table (ctxt, part, &ctable, &chunkmin);

    if (rv != EXR_ERR_SUCCESS) return rv;

    if (ctxt->file_size > 0) maxoff = (uint64_t) ctxt->file_size;
    complete = 1;

    for (int ci = 0; ci < part->chunk_count; ++ci)
    {
        uint64_t cchunk = ctable[ci];
        if (cchunk < chunkmin || cchunk >= maxoff)
        {
            complete = 0;
            break;
        }
    }

    if (!complete) return EXR_ERR_INCOMPLETE_CHUNK_TABLE;

    return EXR_ERR_SUCCESS;
}